

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

int linenoiseHistoryAdd(char *line)

{
  int iVar1;
  char *pcVar2;
  char *linecopy;
  char *line_local;
  
  if (history_max_len == 0) {
    line_local._4_4_ = 0;
  }
  else {
    if (history == (char **)0x0) {
      history = (char **)malloc((long)history_max_len << 3);
      if (history == (char **)0x0) {
        return 0;
      }
      memset(history,0,(long)history_max_len << 3);
    }
    if ((history_len != 0) && (iVar1 = strcmp(history[history_len + -1],line), iVar1 == 0)) {
      return 0;
    }
    pcVar2 = _strdup(line);
    if (pcVar2 == (char *)0x0) {
      line_local._4_4_ = 0;
    }
    else {
      if (history_len == history_max_len) {
        free(*history);
        memmove(history,history + 1,(long)(history_max_len + -1) << 3);
        history_len = history_len + -1;
      }
      history[history_len] = pcVar2;
      history_len = history_len + 1;
      line_local._4_4_ = 1;
    }
  }
  return line_local._4_4_;
}

Assistant:

int linenoiseHistoryAdd(const char *line) {
    char *linecopy;

    if (history_max_len == 0) return 0;

    /* Initialization on first call. */
    if (history == NULL) {
        history = malloc(sizeof(char*)*history_max_len);
        if (history == NULL) return 0;
        memset(history,0,(sizeof(char*)*history_max_len));
    }

    /* Don't add duplicated lines. */
    if (history_len && !strcmp(history[history_len-1], line)) return 0;

    /* Add an heap allocated copy of the line in the history.
     * If we reached the max length, remove the older line. */
    linecopy = _strdup(line);
    if (!linecopy) return 0;
    if (history_len == history_max_len) {
        free(history[0]);
        memmove(history,history+1,sizeof(char*)*(history_max_len-1));
        history_len--;
    }
    history[history_len] = linecopy;
    history_len++;
    return 1;
}